

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O0

void __thiscall
OmegaOP::OmegaOP(OmegaOP *this,vector<double,_std::allocator<double>_> *values,double firstdata,
                double beta,uint n)

{
  size_type sVar1;
  double *pdVar2;
  reference pvVar3;
  double **ppdVar4;
  uint **ppuVar5;
  uint *puVar6;
  uint local_54;
  uint local_50;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint n_local;
  double beta_local;
  double firstdata_local;
  vector<double,_std::allocator<double>_> *values_local;
  OmegaOP *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->changepoints);
  std::vector<double,_std::allocator<double>_>::vector(&this->parameters);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(values);
  this->nbStates = (uint)sVar1;
  pdVar2 = (double *)operator_new__((ulong)this->nbStates << 3);
  this->states = pdVar2;
  for (i_2 = 0; i_2 < this->nbStates; i_2 = i_2 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](values,(ulong)i_2);
    this->states[i_2] = *pvVar3;
  }
  ppdVar4 = (double **)operator_new__(0x18);
  this->S12P = ppdVar4;
  ppdVar4 = (double **)operator_new__((ulong)this->nbStates << 3);
  this->Q = ppdVar4;
  ppuVar5 = (uint **)operator_new__((ulong)this->nbStates << 3);
  this->lastChpt = ppuVar5;
  ppuVar5 = (uint **)operator_new__((ulong)this->nbStates << 3);
  this->lastIndState = ppuVar5;
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    pdVar2 = (double *)operator_new__((ulong)(n + 1) << 3);
    this->S12P[i_3] = pdVar2;
  }
  for (i_4 = 0; i_4 < this->nbStates; i_4 = i_4 + 1) {
    pdVar2 = (double *)operator_new__((ulong)(n + 1) << 3);
    this->Q[i_4] = pdVar2;
  }
  for (i_5 = 0; i_5 < this->nbStates; i_5 = i_5 + 1) {
    puVar6 = (uint *)operator_new__((ulong)(n + 1) << 2);
    this->lastChpt[i_5] = puVar6;
  }
  for (local_50 = 0; local_50 < this->nbStates; local_50 = local_50 + 1) {
    puVar6 = (uint *)operator_new__((ulong)(n + 1) << 2);
    this->lastIndState[local_50] = puVar6;
  }
  for (local_54 = 0; local_54 < this->nbStates; local_54 = local_54 + 1) {
    *this->Q[local_54] = 0.0;
    this->Q[local_54][1] =
         (firstdata - this->states[local_54]) * (firstdata - this->states[local_54]);
    *this->lastIndState[local_54] = local_54;
    this->lastIndState[local_54][1] = local_54;
    *this->lastChpt[local_54] = 0;
    this->lastChpt[local_54][1] = 1;
  }
  this->penalty = beta;
  return;
}

Assistant:

OmegaOP::OmegaOP(std::vector< double >& values, double firstdata, double beta, unsigned int n)
{
  nbStates = values.size();
  states = new double[nbStates];
  for(unsigned int i = 0; i < nbStates; i++){states[i] = values[i];}

  /// MATRIX INITIALIZATION
  S12P = new double*[3]; ///matrix of vectors S1, S2 and SP
  Q = new double*[nbStates]; ///matrix of costs
  lastChpt = new unsigned int*[nbStates]; ///matrix of best last changepoints
  lastIndState = new unsigned int*[nbStates]; ///matrix of starting states for the best last segment

  for(unsigned int i = 0; i < 3; i++){S12P[i] = new double[n + 1];}
  for(unsigned int i = 0; i < nbStates; i++){Q[i] = new double[n + 1];}
  for(unsigned int i = 0; i < nbStates; i++){lastChpt[i] = new unsigned int[n + 1];}
  for(unsigned int i = 0; i < nbStates; i++){lastIndState[i] = new unsigned int[n + 1];}

  /// FILL FIRST COLUMN in Q, lastIndState,lastChpt
  for(unsigned int i = 0; i < nbStates; i++)
  {
    Q[i][0] = 0;
    Q[i][1] = (firstdata - states[i])*(firstdata - states[i]);
    lastIndState[i][0] = i;
    lastIndState[i][1] = i;
    lastChpt[i][0] = 0;
    lastChpt[i][1] = 1;
  }
  penalty = beta;
}